

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void __thiscall ImPool<ImGuiTable>::Clear(ImPool<ImGuiTable> *this)

{
  int *piVar1;
  ImGuiTable *pIVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  iVar3 = (this->Map).Data.Size;
  if (0 < iVar3) {
    lVar6 = 8;
    lVar5 = 0;
    do {
      lVar4 = (long)*(int *)((long)&((this->Map).Data.Data)->key + lVar6);
      if (lVar4 != -1) {
        ImGuiTable::~ImGuiTable((this->Buf).Data + lVar4);
        iVar3 = (this->Map).Data.Size;
      }
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0x10;
    } while (lVar5 < iVar3);
  }
  ImGuiStorage::Clear(&this->Map);
  pIVar2 = (this->Buf).Data;
  if (pIVar2 != (ImGuiTable *)0x0) {
    (this->Buf).Size = 0;
    (this->Buf).Capacity = 0;
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
    (this->Buf).Data = (ImGuiTable *)0x0;
  }
  this->FreeIdx = 0;
  return;
}

Assistant:

void        Clear()                             { for (int n = 0; n < Map.Data.Size; n++) { int idx = Map.Data[n].val_i; if (idx != -1) Buf[idx].~T(); } Map.Clear(); Buf.clear(); FreeIdx = 0; }